

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O2

int mml_parse(uchar *buffer,int bufsize,char *ptr)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  char *stptr;
  uchar *puVar9;
  byte *local_38;
  
  iVar7 = 0;
  do {
    pbVar6 = (byte *)ptr + 1;
    bVar1 = *ptr;
    if ((long)(char)bVar1 == 0) {
      return iVar7;
    }
    local_38 = pbVar6;
    if (bufsize < 7) {
      fatal_error("Internal error: MML buffer too small!");
      return -1;
    }
    switch(bVar1) {
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      uVar3 = *(uint *)(&DAT_001142fc + (long)(char)bVar1 * 4);
      bVar1 = *pbVar6;
      if (bVar1 == 0x23) {
LAB_0010ec95:
        uVar3 = uVar3 + 1;
LAB_0010ec9d:
        pbVar6 = (byte *)ptr + 2;
      }
      else {
        if (bVar1 == 0x2d) {
          uVar3 = uVar3 - 1;
          goto LAB_0010ec9d;
        }
        if (bVar1 == 0x2b) goto LAB_0010ec95;
      }
      local_38 = pbVar6;
      ppuVar5 = __ctype_b_loc();
      bVar1 = *pbVar6;
      uVar8 = snd_length;
      if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 8) != 0) {
        uVar8 = mml_get_length((char **)&local_38);
        bVar1 = *local_38;
        pbVar6 = local_38;
      }
      if (bVar1 == 0x2e) {
        uVar8 = uVar8 * 0xc000 >> 8;
        local_38 = pbVar6 + 1;
      }
      else {
        uVar8 = uVar8 << 8;
      }
      if (uVar8 == 0) {
LAB_0010eeaa:
        stptr = "Incorrect note length!";
LAB_0010eeb1:
        error(stptr);
        return -1;
      }
      uVar3 = (int)(0x36a0600 / (ulong)(uint)(freq_table[uVar3] << ((char)snd_octave - 1U & 0x1f)))
              + 1;
      *buffer = '\x04';
      buffer[1] = (uchar)(uVar3 >> 1);
      buffer[2] = (uchar)(uVar3 >> 9);
      if (snd_wave_flag == '\x01') {
        snd_wave_flag = '\0';
        uVar2 = (char)snd_wave + '\x13';
LAB_0010ed5f:
        snd_off = '\0';
        buffer[3] = uVar2;
        puVar9 = buffer + 4;
        iVar7 = iVar7 + 1;
      }
      else {
        if (snd_off == '\x01') {
          uVar2 = '\x02';
          goto LAB_0010ed5f;
        }
        puVar9 = buffer + 3;
      }
      *puVar9 = '\x05';
      iVar4 = mml_calc_duration(uVar8);
      puVar9[1] = (uchar)iVar4;
      buffer = puVar9 + 2;
      iVar7 = iVar7 + 5;
      break;
    default:
      stptr = "Syntax error!";
      goto LAB_0010eeb1;
    case 0x4c:
      snd_length = mml_get_length((char **)&local_38);
      if (snd_length == 0) goto LAB_0010eeaa;
      break;
    case 0x4f:
      snd_octave = mml_get_value((char **)&local_38);
      if (snd_octave - 8 < 0xfffffff9) {
        stptr = "Incorrect octave!";
        goto LAB_0010eeb1;
      }
      break;
    case 0x52:
      ppuVar5 = __ctype_b_loc();
      bVar1 = *pbVar6;
      if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar1 * 2 + 1) & 8) == 0) {
        uVar3 = 0x400;
      }
      else {
        iVar4 = mml_get_length((char **)&local_38);
        uVar3 = iVar4 << 8;
        bVar1 = *local_38;
        pbVar6 = local_38;
      }
      if (bVar1 == 0x2e) {
        uVar3 = uVar3 * 0xc0 >> 8;
        local_38 = pbVar6 + 1;
      }
      if (uVar3 == 0) goto LAB_0010eeaa;
      buffer[0] = '\x01';
      buffer[1] = '\x05';
      iVar4 = mml_calc_duration(uVar3);
      buffer[2] = (uchar)iVar4;
      buffer = buffer + 3;
      snd_off = '\x01';
      iVar7 = iVar7 + 3;
      break;
    case 0x54:
      snd_tempo = mml_get_value((char **)&local_38);
      if (snd_tempo - 0x101 < 0xffffff1f) {
        stptr = "Incorrect tempo!";
        goto LAB_0010eeb1;
      }
      break;
    case 0x56:
      uVar3 = mml_get_value((char **)&local_38);
      if (0xf < uVar3) {
        stptr = "Incorrect volume!";
        goto LAB_0010eeb1;
      }
      *buffer = '\x03';
      buffer[1] = (char)uVar3 * '\x11';
      buffer = buffer + 2;
      iVar7 = iVar7 + 2;
      break;
    case 0x57:
      snd_wave = mml_get_value((char **)&local_38);
      snd_wave_flag = '\x01';
      if (snd_wave - 4 < 0xfffffffd) {
        stptr = "Incorrect waveform!";
        goto LAB_0010eeb1;
      }
    }
    bufsize = bufsize - iVar7;
    ptr = (char *)local_38;
  } while( true );
}

Assistant:

int
mml_parse(unsigned char *buffer, int bufsize, char *ptr)
{
	unsigned int tone, freq, value, len;
	int size = 0;
	char c;

	/* parse string */
	while ((c = *ptr++) != '\0') {
		/* check buffer size */
		if (bufsize < 7) {
			fatal_error("Internal error: MML buffer too small!");
			return (-1);
		}

		switch (c) {
		/* octave */
		case 'O':
			snd_octave = mml_get_value(&ptr);
	
			if ((snd_octave < 1) || (snd_octave > 7)) {
				error("Incorrect octave!");
				return (-1);
			}
			break;
	
		/* volume */
		case 'V':
			snd_volume = mml_get_value(&ptr);
	
			if (snd_volume > 15) {
				error("Incorrect volume!");
				return (-1);
			}
	
			/* gen code */
			*buffer++ = SND_VOLUME;
			*buffer++ = (snd_volume << 4) + snd_volume;
			size += 2;
			break;

		/* tempo */
		case 'T':
			snd_tempo = mml_get_value(&ptr);
	
			if ((snd_tempo < 32) || (snd_tempo > 256)) {
				error("Incorrect tempo!");
				return (-1);
			}
			break;
	
		/* length */
		case 'L':
			snd_length = mml_get_length(&ptr);
	
			if (!snd_length) {
				error("Incorrect note length!");
				return (-1);
			}
			break;
	
		/* notes */
		case 'A':
		case 'B':
		case 'C':
		case 'D':
		case 'E':
		case 'F':
		case 'G':
			/* base */
			tone = tone_table[c - 'A'];

			/* extra commands */
			if ((*ptr == '#') || (*ptr == '+')) {
				tone++;
				ptr++;
			}
			else if (*ptr == '-') {
				tone--;
				ptr++;
			}
			if (isdigit(*ptr))
				len = (mml_get_length(&ptr) << 8);
			else {
				len = (snd_length << 8);
			}
			if (*ptr == '.') {
				len = (len * 0xC0) >> 8;
				ptr++;
			}

			/* check length */
			if (!len) {
				error("Incorrect note length!");
				return (-1);
			}

			/* calculate frequency */
			freq  = (freq_table[tone] << (snd_octave - 1));
			value = (((3580000 * 16) / freq) + 1) >> 1;

			/* gen code */
			*buffer++ = SND_FREQ;
			*buffer++ = (value)  & 0xFF;
			*buffer++ = (value >> 8) & 0xFF;

			if (snd_wave_flag) {
				/* new waveform */
				snd_wave_flag = 0;
				snd_off = 0;
			   *buffer++ = SND_WAVE_SINE + (snd_wave - 1);
				size += 1;
			}
			else {
				if (snd_off) {
					/* sound on */
					snd_off = 0;
				   *buffer++ = SND_ON;
					size += 1;
				}
			}

			*buffer++ = SND_DURATION;
			*buffer++ = mml_calc_duration(len);
			size += 5;
			break;
	
		/* rest */
		case 'R':
			/* local length */
			if (isdigit(*ptr))
				len = (mml_get_length(&ptr) << 8);
			else {
				len = (0x0400);
			}
			if (*ptr == '.') {
				len = (len * 0xC0) >> 8;
				ptr++;
			}

			/* check length */
			if (!len) {
				error("Incorrect note length!");
				return (-1);
			}

			/* gen code */
			*buffer++ = SND_OFF;
			*buffer++ = SND_DURATION;
			*buffer++ = mml_calc_duration(len);
			snd_off = 1;
			size += 3;
			break;

		/* waveform */
		case 'W':
			snd_wave = mml_get_value(&ptr);
			snd_wave_flag = 1;
	
			if ((snd_wave < 1) || (snd_wave > 3)) {
				error("Incorrect waveform!");
				return (-1);
			}
			break;
	
		/* other */
		default:
			error("Syntax error!");
			return (-1);
		}

		/* update size */
		bufsize -= size;
	}

	/* ok */
	return (size);
}